

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CGL::GLScene::Mesh::draw_edges(Mesh *this)

{
  list<CGL::Edge,_std::allocator<CGL::Edge>_> *plVar1;
  DrawStyle *this_00;
  long lVar2;
  _List_node_base *p_Var3;
  
  DrawStyle::style_edge(this->defaultStyle);
  plVar1 = &(this->mesh).edges;
  p_Var3 = (_List_node_base *)plVar1;
  while (p_Var3 = (((_List_base<CGL::Edge,_std::allocator<CGL::Edge>_> *)&p_Var3->_M_next)->_M_impl)
                  ._M_node.super__List_node_base._M_next, p_Var3 != (_List_node_base *)plVar1) {
    lVar2 = (ulong)((_List_node_base *)(this->hoveredFeature).element == p_Var3 + 1) * 8 + 0xa0;
    if ((_List_node_base *)(this->selectedFeature).element == p_Var3 + 1) {
      lVar2 = 0xb0;
    }
    this_00 = *(DrawStyle **)((long)&(this->super_SceneObject)._vptr_SceneObject + lVar2);
    if (this_00 != this->defaultStyle) {
      DrawStyle::style_edge(this_00);
    }
    glBegin(1);
    glVertex3dv(*(_List_node_base **)((long)(p_Var3[9]._M_next + 2) + 8) + 2);
    glVertex3dv(*(_List_node_base **)
                 ((long)(*(_List_node_base **)((long)(p_Var3[9]._M_next + 1) + 8) + 2) + 8) + 2);
    glEnd();
    if (this_00 != this->defaultStyle) {
      DrawStyle::style_edge(this->defaultStyle);
    }
  }
  DrawStyle::style_reset(this->defaultStyle);
  return;
}

Assistant:

void Mesh::draw_edges() const {
  defaultStyle->style_edge();
  for(EdgeCIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++) {
    DrawStyle *style = get_draw_style(elementAddress(e));
    if (style != defaultStyle) {
      style->style_edge();
    }

    glBegin(GL_LINES);
    glVertex3dv(&e->halfedge()->vertex()->position.x);
    glVertex3dv(&e->halfedge()->twin()->vertex()->position.x);
    glEnd();

    if (style != defaultStyle) {
      defaultStyle->style_edge();
    }
  }
  defaultStyle->style_reset();
}